

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
* deqp::gles31::Functional::wrapCoreFunctions
            (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *__return_storage_ptr__,
            vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
            *fns)

{
  anon_union_8_2_9b810bd7_for_m_func aVar1;
  char *pcVar2;
  size_type __n;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  *this;
  pointer pFVar3;
  size_type sVar4;
  FunctionContainer *__cur;
  pointer pFVar5;
  pointer pFVar6;
  long lVar7;
  size_t __n_00;
  pointer pFVar8;
  char **ppcVar9;
  char **ppcVar10;
  bool bVar11;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pFVar8 = (fns->
           super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pFVar6 = (fns->
           super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __n = ((long)pFVar6 - (long)pFVar8) / 0x18;
  if (pFVar6 == pFVar8) {
    pFVar3 = (pointer)0x0;
  }
  else {
    sVar4 = __n;
    this = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
            *)std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              ::_M_check_len(__return_storage_ptr__,__n,"vector::_M_default_append");
    pFVar3 = std::
             _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             ::_M_allocate(this,sVar4);
    sVar4 = __n;
    pFVar5 = pFVar3;
    while (bVar11 = sVar4 != 0, sVar4 = sVar4 - 1, bVar11) {
      pFVar5->name = (char *)0x0;
      pFVar5->desc = (char *)0x0;
      *(undefined8 *)&pFVar5->function = 0;
      (pFVar5->function).m_func.coreFn = (CoreTestFunc)0x0;
      pFVar5 = pFVar5 + 1;
    }
    std::
    _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
    ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                     *)0x0,(pointer)0x0,__n_00);
    (__return_storage_ptr__->
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
    )._M_impl.super__Vector_impl_data._M_start = pFVar3;
    (__return_storage_ptr__->
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
    )._M_impl.super__Vector_impl_data._M_finish = pFVar3 + __n;
    (__return_storage_ptr__->
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar3 + (long)this;
    pFVar8 = (fns->
             super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pFVar6 = (fns->
             super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  ppcVar10 = &pFVar3->name;
  ppcVar9 = &pFVar8->name;
  for (lVar7 = 0; lVar7 < (int)(((long)pFVar6 - (long)pFVar8) / 0x18); lVar7 = lVar7 + 1) {
    aVar1 = *(anon_union_8_2_9b810bd7_for_m_func *)(ppcVar9 + -1);
    (((FunctionContainer *)(ppcVar10 + -2))->function).m_type = TYPE_CORE;
    *(anon_union_8_2_9b810bd7_for_m_func *)(ppcVar10 + -1) = aVar1;
    pcVar2 = ppcVar9[1];
    *ppcVar10 = *ppcVar9;
    ppcVar10[1] = pcVar2;
    ppcVar10 = ppcVar10 + 4;
    ppcVar9 = ppcVar9 + 3;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<FunctionContainer> wrapCoreFunctions (const vector<NegativeTestShared::FunctionContainer>& fns)
{
	vector<FunctionContainer> retVal;

	retVal.resize(fns.size());
	for (int ndx = 0; ndx < (int)fns.size(); ++ndx)
	{
		retVal[ndx].function = TestFunctionWrapper(fns[ndx].function);
		retVal[ndx].name = fns[ndx].name;
		retVal[ndx].desc = fns[ndx].desc;
	}

	return retVal;
}